

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void __thiscall
helics::HandleManager::setHandleOption
          (HandleManager *this,InterfaceHandle handle,int32_t option,int32_t val)

{
  byte *pbVar1;
  bool bVar2;
  reference pBVar3;
  uint16_t uVar4;
  iterator *piVar5;
  
  bVar2 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    (handle.hid,&this->handles);
  if (!bVar2) {
    return;
  }
  if (option == 0x1a6) {
    piVar5 = &(this->handles).
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start;
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](piVar5,(long)handle.hid);
    if (pBVar3->handleType != ENDPOINT) {
      return;
    }
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](piVar5,(long)handle.hid);
    if (val == 0) {
      uVar4 = pBVar3->flags & 0xbfff;
    }
    else {
      uVar4 = pBVar3->flags | 0x4000;
    }
  }
  else if (option == 0x192) {
    piVar5 = &(this->handles).
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start;
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](piVar5,(long)handle.hid);
    if (val != 0) {
      pBVar3->flags = pBVar3->flags & 0xfffb;
      pBVar3 = std::
               _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
               ::operator[](piVar5,(long)handle.hid);
      pbVar1 = (byte *)((long)&pBVar3->flags + 1);
      *pbVar1 = *pbVar1 | 1;
      return;
    }
    uVar4 = pBVar3->flags & 0xfeff;
  }
  else if (option == 0x19c) {
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](&(this->handles).
                           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(long)handle.hid);
    if (val == 0) {
      uVar4 = pBVar3->flags & 0xff7f;
    }
    else {
      uVar4 = pBVar3->flags | 0x80;
    }
  }
  else {
    if (option != 0x18d) {
      return;
    }
    piVar5 = &(this->handles).
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start;
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](piVar5,(long)handle.hid);
    if (val != 0) {
      pBVar3->flags = pBVar3->flags & 0xfeff;
      pBVar3 = std::
               _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
               ::operator[](piVar5,(long)handle.hid);
      *(byte *)&pBVar3->flags = (byte)pBVar3->flags | 4;
      return;
    }
    uVar4 = pBVar3->flags & 0xfffb;
  }
  pBVar3->flags = uVar4;
  return;
}

Assistant:

void HandleManager::setHandleOption(InterfaceHandle handle, int32_t option, int32_t val)
{
    auto index = handle.baseValue();
    if (isValidIndex(index, handles)) {
        switch (option) {
            case HELICS_HANDLE_OPTION_CONNECTION_REQUIRED:
                if (val != 0) {
                    clearActionFlag(handles[index], optional_flag);
                    setActionFlag(handles[index], required_flag);
                } else {
                    clearActionFlag(handles[index], required_flag);
                }
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_OPTIONAL:
                if (val != 0) {
                    clearActionFlag(handles[index], required_flag);
                    setActionFlag(handles[index], optional_flag);
                } else {
                    clearActionFlag(handles[index], optional_flag);
                }
                break;
            case HELICS_HANDLE_OPTION_RECEIVE_ONLY:
                if (handles[index].handleType == InterfaceType::ENDPOINT) {
                    if (val != 0) {
                        setActionFlag(handles[index], receive_only_flag);
                    } else {
                        clearActionFlag(handles[index], receive_only_flag);
                    }
                }
                break;
            case HELICS_HANDLE_OPTION_RECONNECTABLE:
                if (val != 0) {
                    setActionFlag(handles[index], reconnectable_flag);
                } else {
                    clearActionFlag(handles[index], reconnectable_flag);
                }
                break;
            default:
                break;
        }
    }
}